

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O3

BigInteger * __thiscall rapidjson::internal::BigInteger::operator*=(BigInteger *this,uint64_t u)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (u != 1) {
    if (u == 0) {
      this->digits_[0] = 0;
    }
    else {
      if ((this->count_ != 1) || (this->digits_[0] != 1)) {
        if (this->count_ == 0) {
          return this;
        }
        uVar2 = 0;
        uVar1 = 0;
        do {
          uVar4 = this->digits_[uVar2] & 0xffffffff;
          uVar5 = this->digits_[uVar2] >> 0x20;
          uVar7 = uVar4 * (u & 0xffffffff);
          uVar3 = uVar5 * (u & 0xffffffff);
          lVar6 = uVar5 * (u >> 0x20);
          uVar4 = uVar4 * (u >> 0x20) + uVar3 + (uVar7 >> 0x20);
          lVar8 = lVar6 + 0x100000000;
          if (uVar3 <= uVar4) {
            lVar8 = lVar6;
          }
          uVar3 = (uVar7 & 0xffffffff) + uVar1 + (uVar4 << 0x20);
          uVar1 = (uVar4 >> 0x20) + lVar8 + (ulong)(uVar3 < uVar1);
          this->digits_[uVar2] = uVar3;
          uVar2 = uVar2 + 1;
          uVar3 = this->count_;
        } while (uVar2 < uVar3);
        if (uVar1 == 0) {
          return this;
        }
        if (uVar3 < 0x1a0) {
          this->count_ = uVar3 + 1;
          this->digits_[uVar3] = uVar1;
          return this;
        }
        __assert_fail("count_ < kCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/biginteger.h"
                      ,0xeb,"void rapidjson::internal::BigInteger::PushBack(Type)");
      }
      this->digits_[0] = u;
    }
    this->count_ = 1;
  }
  return this;
}

Assistant:

BigInteger& operator*=(uint64_t u) {
        if (u == 0) return *this = 0;
        if (u == 1) return *this;
        if (*this == 1) return *this = u;

        uint64_t k = 0;
        for (size_t i = 0; i < count_; i++) {
            uint64_t hi;
            digits_[i] = MulAdd64(digits_[i], u, k, &hi);
            k = hi;
        }
        
        if (k > 0)
            PushBack(k);

        return *this;
    }